

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fm_formats.c
# Opt level: O2

FMContext new_FMContext(void)

{
  FMfloat_format FVar1;
  FMContext p_Var2;
  double d;
  
  FVar1 = init_float_formats_done;
  if ((init_float_formats_done == Format_Unknown) &&
     (FVar1 = Format_IEEE_754_bigendian, fm_my_float_format = FVar1,
     IEEE_754_8_bigendian != (uchar  [8])0x3f80000000000000)) {
    if (IEEE_754_8_littleendian == (uchar  [8])0x3f80000000000000) {
      fm_my_float_format = Format_IEEE_754_littleendian;
    }
    else if (IEEE_754_8_mixedendian == (uchar  [8])0x3f80000000000000) {
      fm_my_float_format = Format_IEEE_754_mixedendian;
    }
    else {
      fm_my_float_format = Format_Unknown;
      fwrite("Warning, unknown local floating point format\n",0x2d,1,_stderr);
      FVar1 = init_float_formats_done + Format_IEEE_754_bigendian;
    }
  }
  init_float_formats_done = FVar1;
  p_Var2 = (FMContext)ffs_malloc(0x68);
  *(undefined8 *)&p_Var2->errno_val = 0;
  p_Var2->result = (char *)0x0;
  p_Var2->master_context = (FMContext)0x0;
  p_Var2->self_server = 0;
  p_Var2->self_server_fallback = 0;
  p_Var2->server_client_data = (void *)0x0;
  p_Var2->server_fd = (void *)0x0;
  p_Var2->server_pid = 0;
  p_Var2->format_server_identifier = 0;
  p_Var2->server_byte_reversal = 0;
  p_Var2->ignore_default_values = 0;
  *(undefined8 *)&p_Var2->format_list_size = 0;
  p_Var2->format_list = (FMFormat_conflict *)0x0;
  p_Var2->native_float_format = fm_my_float_format;
  p_Var2->native_column_major_arrays = 0;
  p_Var2->ref_count = 1;
  p_Var2->reg_format_count = 0;
  p_Var2->byte_reversal = 0;
  p_Var2->native_pointer_size = 8;
  p_Var2->self_server = 0;
  p_Var2->server_fd = (void *)0xffffffffffffffff;
  p_Var2->server_byte_reversal = 0;
  p_Var2->ignore_default_values = 0;
  return p_Var2;
}

Assistant:

extern
FMContext
new_FMContext()
{
    FMContext c;
    init_float_formats();
    c = (FMContext) malloc((size_t) sizeof(FMContextStruct));
    memset(c, 0, sizeof(FMContextStruct));
    c->ref_count = 1;
    c->format_list_size = 0;
    c->format_list = NULL;
    c->reg_format_count = 0;
    c->byte_reversal = 0;
    c->native_float_format = fm_my_float_format;
    c->native_column_major_arrays = 0;
    c->native_pointer_size = sizeof(char*);
    c->errno_val = 0;
    c->ignore_default_values = 0;
    c->result = NULL;
    
    c->self_server = 0;
    c->self_server_fallback = 0;
    c->server_fd = (char *) -1;
    c->server_pid = 0;
    c->server_byte_reversal = 0;
    c->master_context = NULL;

    return (c);
}